

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O1

void QtPromisePrivate::PromiseFulfill<QtPromise::QPromise<void>>::
     call<QtPromise::QPromise<void>,QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
               (QPromise<void> *promise,QPromiseResolve<void> *resolve,QPromiseReject<void> *reject)

{
  QSharedData *pQVar1;
  PromiseDataBase<void,_void_()> *pPVar2;
  anon_class_24_3_5928a092 callback;
  bool bVar3;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_68;
  QPromiseBase<void> local_60;
  anon_class_24_2_d74e9aa7 local_50;
  QPromise<void> *local_38;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *pQStack_30;
  anon_class_24_2_d74e9aa7 *local_28;
  
  pPVar2 = &((promise->super_QPromiseBase<void>).m_d.d)->super_PromiseDataBase<void,_void_()>;
  bVar3 = PromiseDataBase<void,_void_()>::isPending(pPVar2);
  if ((!bVar3) && ((pPVar2->m_error).m_data._M_exception_object == (void *)0x0)) {
    PromiseResolver<void>::resolve(&resolve->m_resolver);
    return;
  }
  pPVar2 = &((promise->super_QPromiseBase<void>).m_d.d)->super_PromiseDataBase<void,_void_()>;
  bVar3 = PromiseDataBase<void,_void_()>::isPending(pPVar2);
  if ((!bVar3) && ((pPVar2->m_error).m_data._M_exception_object != (void *)0x0)) {
    PromiseResolver<void>::reject<QtPromisePrivate::PromiseError_const&>
              (&reject->m_resolver,
               &(((promise->super_QPromiseBase<void>).m_d.d)->super_PromiseDataBase<void,_void_()>).
                m_error);
    return;
  }
  local_68.d = (resolve->m_resolver).m_d.d;
  if (local_68.d != (Data *)0x0) {
    LOCK();
    ((local_68.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value = (Type)((int)((local_68.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  local_50.reject.m_resolver.m_d.d = (PromiseResolver<void>)(reject->m_resolver).m_d.d;
  if (local_50.reject.m_resolver.m_d.d !=
      (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)0x0) {
    LOCK();
    (((Data *)local_50.reject.m_resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((Data *)local_50.reject.m_resolver.m_d.d)->super_QSharedData).ref.
                     super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  local_50.promise.super_QPromiseBase<void>.m_d.d = (promise->super_QPromiseBase<void>).m_d.d;
  if (local_50.promise.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((local_50.promise.super_QPromiseBase<void>.m_d.d)->
              super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_28 = &local_50;
  local_50.promise.super_QPromiseBase<void>._vptr_QPromiseBase =
       (_func_int **)&PTR__QPromiseBase_0011abf0;
  pQStack_30 = &local_68;
  callback.fulfilled = (anon_class_8_1_c4c2b4cc *)pQStack_30;
  callback.this = &promise->super_QPromiseBase<void>;
  callback.rejected = local_28;
  local_38 = promise;
  QtPromise::QPromiseBase<void>::
  QPromiseBase<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_include____src_qtpromise_qpromise_inl:58:22),_0>
            (&local_60,callback);
  local_60._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011abf0;
  bVar3 = PromiseDataBase<void,_void_()>::isPending
                    (&((promise->super_QPromiseBase<void>).m_d.d)->
                      super_PromiseDataBase<void,_void_()>);
  if (!bVar3) {
    PromiseDataBase<void,_void_()>::dispatch
              (&((promise->super_QPromiseBase<void>).m_d.d)->super_PromiseDataBase<void,_void_()>);
  }
  local_60._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011ac38;
  if (local_60.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((local_60.m_d.d)->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) && (local_60.m_d.d != (PromiseData<void> *)0x0)) {
      (*((local_60.m_d.d)->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase[1])();
    }
  }
  local_50.promise.super_QPromiseBase<void>._vptr_QPromiseBase =
       (_func_int **)&PTR__QPromiseBase_0011ac38;
  if (local_50.promise.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((local_50.promise.super_QPromiseBase<void>.m_d.d)->
              super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (local_50.promise.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0)) {
      (*((local_50.promise.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
        _vptr_PromiseDataBase[1])();
    }
  }
  if (local_50.reject.m_resolver.m_d.d !=
      (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)0x0) {
    LOCK();
    (((QSharedData *)local_50.reject.m_resolver.m_d.d)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((QSharedData *)local_50.reject.m_resolver.m_d.d)->ref).
                     super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + -1);
    UNLOCK();
    if (((__atomic_base<int>)
         *(__int_type *)
          &(((QSharedData *)local_50.reject.m_resolver.m_d.d)->ref).super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) &&
       (local_50.reject.m_resolver.m_d.d !=
        (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)0x0)) {
      operator_delete((void *)local_50.reject.m_resolver.m_d.d,0x10);
    }
  }
  if (local_68.d != (Data *)0x0) {
    LOCK();
    ((local_68.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_68.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((local_68.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
       (local_68.d != (Data *)0x0)) {
      operator_delete(local_68.d,0x10);
    }
  }
  return;
}

Assistant:

static void call(const TPromise& promise, const TResolve& resolve, const TReject& reject)
    {
        if (promise.isFulfilled()) {
            resolve();
        } else if (promise.isRejected()) {
            reject(promise.m_d->error());
        } else {
            promise.then(
                [=]() {
                    resolve();
                },
                [=]() { // catch all
                    reject(promise.m_d->error());
                });
        }
    }